

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps.cc
# Opt level: O0

void __thiscall
MissingDependencyScanner::ProcessNodeDeps
          (MissingDependencyScanner *this,Node *node,Node **dep_nodes,int dep_nodes_count)

{
  MissingDependencyScannerDelegate *pMVar1;
  Node **ppNVar2;
  bool bVar3;
  string *psVar4;
  reference ppEVar5;
  Edge *pEVar6;
  reference ppEVar7;
  Rule *pRVar8;
  size_type sVar9;
  pair<std::_Rb_tree_const_iterator<Node_*>,_bool> pVar10;
  Rule *local_120;
  _Base_ptr local_118;
  undefined1 local_110;
  int local_104;
  iterator iStack_100;
  int i_1;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_f8;
  iterator ne;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missing_deps_rule_names;
  _Self local_b8;
  iterator de;
  vector<Edge_*,_std::allocator<Edge_*>_> missing_deps;
  Edge *local_88;
  Edge *deplog_edge;
  Node *local_70;
  Node *deplog_node;
  undefined1 local_60 [4];
  int i;
  set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> deplog_edges;
  Edge *edge;
  int dep_nodes_count_local;
  Node **dep_nodes_local;
  Node *node_local;
  MissingDependencyScanner *this_local;
  
  dep_nodes_local = (Node **)node;
  node_local = (Node *)this;
  deplog_edges._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)Node::in_edge(node);
  std::set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_>::set
            ((set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)local_60);
  deplog_node._4_4_ = 0;
  do {
    if (dep_nodes_count <= deplog_node._4_4_) {
      std::vector<Edge_*,_std::allocator<Edge_*>_>::vector
                ((vector<Edge_*,_std::allocator<Edge_*>_> *)&de);
      local_b8._M_node =
           (_Base_ptr)
           std::set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_>::begin
                     ((set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)local_60);
      while( true ) {
        missing_deps_rule_names._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)std::set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_>::end
                               ((set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)local_60)
        ;
        bVar3 = std::operator!=(&local_b8,
                                (_Self *)&missing_deps_rule_names._M_t._M_impl.super__Rb_tree_header
                                          ._M_node_count);
        if (!bVar3) break;
        ppEVar5 = std::_Rb_tree_const_iterator<Edge_*>::operator*(&local_b8);
        bVar3 = PathExistsBetween(this,*ppEVar5,
                                  (Edge *)deplog_edges._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count);
        if (!bVar3) {
          ppEVar5 = std::_Rb_tree_const_iterator<Edge_*>::operator*(&local_b8);
          std::vector<Edge_*,_std::allocator<Edge_*>_>::push_back
                    ((vector<Edge_*,_std::allocator<Edge_*>_> *)&de,ppEVar5);
        }
        std::_Rb_tree_const_iterator<Edge_*>::operator++(&local_b8);
      }
      bVar3 = std::vector<Edge_*,_std::allocator<Edge_*>_>::empty
                        ((vector<Edge_*,_std::allocator<Edge_*>_> *)&de);
      if (!bVar3) {
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ne);
        local_f8._M_current =
             (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin
                                ((vector<Edge_*,_std::allocator<Edge_*>_> *)&de);
        while( true ) {
          iStack_100 = std::vector<Edge_*,_std::allocator<Edge_*>_>::end
                                 ((vector<Edge_*,_std::allocator<Edge_*>_> *)&de);
          bVar3 = __gnu_cxx::operator!=(&local_f8,&stack0xffffffffffffff00);
          if (!bVar3) break;
          for (local_104 = 0; local_104 < dep_nodes_count; local_104 = local_104 + 1) {
            pEVar6 = Node::in_edge(dep_nodes[local_104]);
            ppEVar7 = __gnu_cxx::
                      __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                      operator*(&local_f8);
            if (pEVar6 == *ppEVar7) {
              pVar10 = std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::insert
                                 (&this->generated_nodes_,dep_nodes + local_104);
              local_118 = (_Base_ptr)pVar10.first._M_node;
              local_110 = pVar10.second;
              ppEVar7 = __gnu_cxx::
                        __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                        operator*(&local_f8);
              local_120 = Edge::rule(*ppEVar7);
              std::set<const_Rule_*,_std::less<const_Rule_*>,_std::allocator<const_Rule_*>_>::insert
                        (&this->generator_rules_,&local_120);
              ppEVar7 = __gnu_cxx::
                        __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                        operator*(&local_f8);
              pRVar8 = Edge::rule(*ppEVar7);
              psVar4 = Rule::name_abi_cxx11_(pRVar8);
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&ne,psVar4);
              ppNVar2 = dep_nodes_local;
              pMVar1 = this->delegate_;
              psVar4 = Node::path_abi_cxx11_(dep_nodes[local_104]);
              ppEVar7 = __gnu_cxx::
                        __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
                        operator*(&local_f8);
              pRVar8 = Edge::rule(*ppEVar7);
              (*pMVar1->_vptr_MissingDependencyScannerDelegate[2])(pMVar1,ppNVar2,psVar4,pRVar8);
            }
          }
          __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
          operator++(&local_f8);
        }
        sVar9 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&ne);
        this->missing_dep_path_count_ = this->missing_dep_path_count_ + (int)sVar9;
        std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::insert
                  (&this->nodes_missing_deps_,(value_type *)&dep_nodes_local);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&ne);
      }
      std::vector<Edge_*,_std::allocator<Edge_*>_>::~vector
                ((vector<Edge_*,_std::allocator<Edge_*>_> *)&de);
      deplog_edge._0_4_ = 0;
LAB_001420af:
      std::set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_>::~set
                ((set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)local_60);
      return;
    }
    local_70 = dep_nodes[deplog_node._4_4_];
    psVar4 = Node::path_abi_cxx11_(local_70);
    bVar3 = std::operator==(psVar4,"build.ninja");
    if (bVar3) {
      deplog_edge._0_4_ = 1;
      goto LAB_001420af;
    }
    local_88 = Node::in_edge(local_70);
    if (local_88 != (Edge *)0x0) {
      std::set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_>::insert
                ((set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)local_60,&local_88);
    }
    deplog_node._4_4_ = deplog_node._4_4_ + 1;
  } while( true );
}

Assistant:

void MissingDependencyScanner::ProcessNodeDeps(Node* node, Node** dep_nodes,
                                               int dep_nodes_count) {
  Edge* edge = node->in_edge();
  std::set<Edge*> deplog_edges;
  for (int i = 0; i < dep_nodes_count; ++i) {
    Node* deplog_node = dep_nodes[i];
    // Special exception: A dep on build.ninja can be used to mean "always
    // rebuild this target when the build is reconfigured", but build.ninja is
    // often generated by a configuration tool like cmake or gn. The rest of
    // the build "implicitly" depends on the entire build being reconfigured,
    // so a missing dep path to build.ninja is not an actual missing dependency
    // problem.
    if (deplog_node->path() == "build.ninja")
      return;
    Edge* deplog_edge = deplog_node->in_edge();
    if (deplog_edge) {
      deplog_edges.insert(deplog_edge);
    }
  }
  std::vector<Edge*> missing_deps;
  for (std::set<Edge*>::iterator de = deplog_edges.begin();
       de != deplog_edges.end(); ++de) {
    if (!PathExistsBetween(*de, edge)) {
      missing_deps.push_back(*de);
    }
  }

  if (!missing_deps.empty()) {
    std::set<std::string> missing_deps_rule_names;
    for (std::vector<Edge*>::iterator ne = missing_deps.begin();
         ne != missing_deps.end(); ++ne) {
      for (int i = 0; i < dep_nodes_count; ++i) {
        if (dep_nodes[i]->in_edge() == *ne) {
          generated_nodes_.insert(dep_nodes[i]);
          generator_rules_.insert(&(*ne)->rule());
          missing_deps_rule_names.insert((*ne)->rule().name());
          delegate_->OnMissingDep(node, dep_nodes[i]->path(), (*ne)->rule());
        }
      }
    }
    missing_dep_path_count_ += missing_deps_rule_names.size();
    nodes_missing_deps_.insert(node);
  }
}